

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

void Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
     ::VerifyBlockConsistencyInList
               (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *heapBlock,
               RecyclerVerifyListConsistencyData *recyclerSweep)

{
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *pSVar7;
  char *message;
  char *error;
  uint lineNumber;
  
  pSVar1 = (recyclerSweep->mediumBlockVerifyListConsistencyData).nextAllocableBlockHead;
  if (pSVar1 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock) {
    (recyclerSweep->mediumBlockVerifyListConsistencyData).expectFull = false;
  }
  bVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::IsClearedFromAllocator
                    ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock);
  if (bVar3) {
    if (((recyclerSweep->mediumBlockVerifyListConsistencyData).expectFull != true) ||
       ((recyclerSweep->mediumBlockVerifyListConsistencyData).expectDispose == true)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x3bb,"(*expectFull && !*expectDispose)","*expectFull && !*expectDispose")
      ;
      if (!bVar3) goto LAB_006cef24;
      *puVar6 = 0;
    }
    if ((heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
        super_SmallHeapBlockT<MediumAllocationBlockAttributes>.freeObjectList == (FreeObject *)0x0)
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x3bc,"(heapBlock->HasFreeObject())","heapBlock->HasFreeObject()");
      if (!bVar3) goto LAB_006cef24;
      *puVar6 = 0;
    }
    bVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::HasAnyDisposeObjects
                      ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock);
    if (!bVar3) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    error = "(!heapBlock->HasAnyDisposeObjects())";
    message = "!heapBlock->HasAnyDisposeObjects()";
    lineNumber = 0x3bd;
  }
  else if ((recyclerSweep->mediumBlockVerifyListConsistencyData).expectDispose == true) {
    uVar5 = (uint)(heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                  super_SmallHeapBlockT<MediumAllocationBlockAttributes>.super_HeapBlock.
                  heapBlockType;
    if (((10 < uVar5) || ((0x528U >> (uVar5 & 0x1f) & 1) == 0)) ||
       (pSVar7 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>
                           ((HeapBlock *)heapBlock), pSVar7->isPendingDispose == false)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x3c2,
                         "(heapBlock->IsAnyFinalizableBlock() && heapBlock->template AsFinalizableBlock<typename TBlockType::HeapBlockAttributes>()->IsPendingDispose())"
                         ,
                         "heapBlock->IsAnyFinalizableBlock() && heapBlock->template AsFinalizableBlock<typename TBlockType::HeapBlockAttributes>()->IsPendingDispose()"
                        );
      if (!bVar3) goto LAB_006cef24;
      *puVar6 = 0;
    }
    bVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::HasAnyDisposeObjects
                      ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock);
    if (bVar3) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    error = "(heapBlock->HasAnyDisposeObjects())";
    message = "heapBlock->HasAnyDisposeObjects()";
    lineNumber = 0x3c3;
  }
  else {
    bVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::HasAnyDisposeObjects
                      ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x3c7,"(!heapBlock->HasAnyDisposeObjects())",
                         "!heapBlock->HasAnyDisposeObjects()");
      if (!bVar3) goto LAB_006cef24;
      *puVar6 = 0;
    }
    bVar3 = (recyclerSweep->mediumBlockVerifyListConsistencyData).expectFull;
    if ((heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
        super_SmallHeapBlockT<MediumAllocationBlockAttributes>.freeObjectList == (FreeObject *)0x0)
    {
      bVar4 = true;
    }
    else {
      bVar4 = SmallHeapBlockT<MediumAllocationBlockAttributes>::IsInAllocator
                        ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock);
    }
    if (pSVar1 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      return;
    }
    if (bVar4 == bVar3) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    error = 
    "(*expectFull == (!heapBlock->HasFreeObject() || heapBlock->IsInAllocator()) || nextAllocableBlockHead == nullptr)"
    ;
    message = 
    "*expectFull == (!heapBlock->HasFreeObject() || heapBlock->IsInAllocator()) || nextAllocableBlockHead == nullptr"
    ;
    lineNumber = 0x3d3;
  }
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                     ,lineNumber,error,message);
  if (bVar3) {
    *puVar6 = 0;
    return;
  }
LAB_006cef24:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void
HeapBucketT<TBlockType>::VerifyBlockConsistencyInList(TBlockType * heapBlock, RecyclerVerifyListConsistencyData& recyclerSweep)
{
    bool* expectFull = nullptr;
    bool* expectDispose = nullptr;
    HeapBlock* nextAllocableBlockHead = nullptr;

    if (TBlockType::HeapBlockAttributes::IsSmallBlock)
    {
        expectFull = &recyclerSweep.smallBlockVerifyListConsistencyData.expectFull;
        expectDispose = &recyclerSweep.smallBlockVerifyListConsistencyData.expectDispose;
        nextAllocableBlockHead = recyclerSweep.smallBlockVerifyListConsistencyData.nextAllocableBlockHead;
    }
    else if (TBlockType::HeapBlockAttributes::IsMediumBlock)
    {
        expectFull = &recyclerSweep.mediumBlockVerifyListConsistencyData.expectFull;
        expectDispose = &recyclerSweep.mediumBlockVerifyListConsistencyData.expectDispose;
        nextAllocableBlockHead = recyclerSweep.mediumBlockVerifyListConsistencyData.nextAllocableBlockHead;
    }
    else
    {
        Assert(false);
    }

    if (heapBlock == nextAllocableBlockHead)
    {
        (*expectFull) = false;
    }
    if (heapBlock->IsClearedFromAllocator())
    {
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        // As the blocks are added to a SLIST and used from there during concurrent sweep, the expectFull assertion doesn't hold anymore.
        // We could do some work to make this work again but there may be perf hit and it may be fragile.
        if (!CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
#endif
        {
            Assert(*expectFull && !*expectDispose);
            Assert(heapBlock->HasFreeObject());
            Assert(!heapBlock->HasAnyDisposeObjects());
        }
    }
    else if (*expectDispose)
    {
        Assert(heapBlock->IsAnyFinalizableBlock() && heapBlock->template AsFinalizableBlock<typename TBlockType::HeapBlockAttributes>()->IsPendingDispose());
        Assert(heapBlock->HasAnyDisposeObjects());
    }
    else
    {
        Assert(!heapBlock->HasAnyDisposeObjects());

        // ExpectFull is a bit of a misnomer if the list in question is the heap block list. It's there to check
        // of the heap block in question is before the nextAllocableBlockHead or not. This is to ensure that
        // blocks before nextAllocableBlockHead that are not being bump allocated from must be considered "full".
        // However, the exception is if this is the only heap block in this bucket, in which case nextAllocableBlockHead
        // would be null
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        // As the blocks are added to the SLIST and used from there during concurrent sweep, the expectFull assertion doesn't hold anymore.
        if (!CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
#endif
        {
            Assert(*expectFull == (!heapBlock->HasFreeObject() || heapBlock->IsInAllocator()) || nextAllocableBlockHead == nullptr);
        }
    }
}